

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O3

bool __thiscall miniros::names::Path::startsWith(Path *this,Path *other)

{
  bool bVar1;
  int iVar2;
  Path *pPVar3;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  ulong uVar6;
  char *__s2;
  char *__s1;
  ulong uVar7;
  Path *pPVar8;
  ulong uVar9;
  Path *pPVar10;
  
  if (this->m_absolute != other->m_absolute) {
    return false;
  }
  pPVar10 = (Path *)(other->m_ns).
                    super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = (long)(other->m_ns).
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar10 >> 4;
  uVar7 = ((other->m_lastName)._M_len != 0) + uVar6;
  pPVar8 = (Path *)(this->m_ns).
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
  uVar9 = (long)(this->m_ns).
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar8 >> 4;
  if ((uVar9 + 1) - (ulong)((this->m_lastName)._M_len == 0) < uVar7) {
LAB_001e7368:
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (uVar7 != 0) {
      uVar5 = 0;
      do {
        pPVar3 = this;
        if (uVar9 == uVar5) {
LAB_001e739c:
          __n = (pPVar3->m_lastName)._M_len;
          __s1 = (pPVar3->m_lastName)._M_str;
        }
        else {
          __n = 0;
          __s1 = (char *)0x0;
          pPVar3 = pPVar8;
          if (uVar5 < uVar9) goto LAB_001e739c;
        }
        pPVar3 = other;
        if (uVar6 == uVar5) {
LAB_001e73ba:
          sVar4 = (pPVar3->m_lastName)._M_len;
          __s2 = (pPVar3->m_lastName)._M_str;
        }
        else {
          sVar4 = 0;
          __s2 = (char *)0x0;
          pPVar3 = pPVar10;
          if (uVar5 < uVar6) goto LAB_001e73ba;
        }
        if (__n != sVar4) goto LAB_001e7368;
        if (__n != 0) {
          iVar2 = bcmp(__s1,__s2,__n);
          if (iVar2 != 0) goto LAB_001e7368;
        }
        uVar5 = uVar5 + 1;
        pPVar10 = (Path *)&pPVar10->m_absolute;
        pPVar8 = (Path *)&pPVar8->m_absolute;
      } while (uVar7 != uVar5);
      bVar1 = true;
    }
  }
  return bVar1;
}

Assistant:

bool Path::isAbsolute() const
{
  return m_absolute;
}